

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_parser_parseQuasiUnquote(sysbvm_context_t *context,sysbvm_parser_state_t *state)

{
  size_t startIndex;
  int iVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t sourcePosition;
  
  iVar1 = sysbvm_parser_lookKindAt(state,0);
  if (iVar1 == 0x1c) {
    startIndex = state->tokenPosition;
    state->tokenPosition = startIndex + 1;
    sVar2 = sysbvm_parser_parsePrimaryTerm(context,state);
    sourcePosition =
         sysbvm_parser_makeSourcePositionForTokenRange
                   (context,state->sourceCode,state->tokenSequence,startIndex,state->tokenPosition);
    sVar2 = sysbvm_astQuasiUnquoteNode_create(context,sourcePosition,sVar2);
    return sVar2;
  }
  sVar2 = sysbvm_parser_makeSourcePositionForParserState(context,state);
  sVar2 = sysbvm_astErrorNode_createWithCString(context,sVar2,"Expected a quote token.");
  return sVar2;
}

Assistant:

static sysbvm_tuple_t sysbvm_parser_parseQuasiUnquote(sysbvm_context_t *context, sysbvm_parser_state_t *state)
{
    if(sysbvm_parser_lookKindAt(state, 0) != SYSBVM_TOKEN_KIND_QUASI_UNQUOTE)
        return sysbvm_astErrorNode_createWithCString(context, sysbvm_parser_makeSourcePositionForParserState(context, state), "Expected a quote token.");
    
    size_t startPosition = state->tokenPosition;
    ++state->tokenPosition;

    sysbvm_tuple_t node = sysbvm_parser_parsePrimaryTerm(context, state);
    size_t endPosition = state->tokenPosition;
    return sysbvm_astQuasiUnquoteNode_create(context, sysbvm_parser_makeSourcePositionForTokenRange(context, state->sourceCode, state->tokenSequence, startPosition, endPosition), node);
}